

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::enforceNotReservedTag
          (anon_unknown_26 *this,StringRef tag,SourceLineInfo *_lineInfo)

{
  StringRef tag_00;
  bool bVar1;
  ReusableStringStream *pRVar2;
  ReusableStringStream local_60;
  string local_50;
  anon_unknown_26 *local_30;
  char *local_28;
  SourceLineInfo *local_20;
  SourceLineInfo *_lineInfo_local;
  StringRef tag_local;
  
  local_20 = (SourceLineInfo *)tag.m_size;
  local_28 = tag.m_start;
  tag_00.m_size = (size_type)local_28;
  tag_00.m_start = (char *)this;
  local_30 = this;
  _lineInfo_local = (SourceLineInfo *)this;
  tag_local.m_start = local_28;
  bVar1 = isReservedTag(tag_00);
  if (!bVar1) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_60);
  pRVar2 = ReusableStringStream::operator<<(&local_60,(char (*) [12])"Tag name: [");
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(StringRef *)&_lineInfo_local);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [19])"] is not allowed.\n");
  pRVar2 = ReusableStringStream::operator<<
                     (pRVar2,(char (*) [66])
                             "Tag names starting with non alphanumeric characters are reserved\n");
  pRVar2 = ReusableStringStream::operator<<(pRVar2,local_20);
  ReusableStringStream::str_abi_cxx11_(&local_50,pRVar2);
  throw_domain_error(&local_50);
}

Assistant:

void enforceNotReservedTag( StringRef tag, SourceLineInfo const& _lineInfo ) {
            CATCH_ENFORCE( !isReservedTag(tag),
                          "Tag name: [" << tag << "] is not allowed.\n"
                          << "Tag names starting with non alphanumeric characters are reserved\n"
                          << _lineInfo );
        }